

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::DeepScanLineInputFile::setFrameBuffer
          (DeepScanLineInputFile *this,DeepFrameBuffer *frameBuffer)

{
  Data *this_00;
  element_type *peVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  double dVar5;
  bool bVar6;
  PixelType PVar7;
  undefined4 uVar8;
  int iVar9;
  mutex *__mutex;
  
  __mutex = &((this->_data).
              super___shared_ptr<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_mx;
  iVar9 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar9 == 0) {
    this_00 = (this->_data).
              super___shared_ptr<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    Data::prepFillList(this_00,frameBuffer,&this_00->fill_list);
    peVar1 = (this->_data).
             super___shared_ptr<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
    ::operator=((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                 *)&peVar1->frameBuffer,
                (_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                 *)frameBuffer);
    bVar6 = (frameBuffer->_sampleCounts).yTileCoords;
    (peVar1->frameBuffer)._sampleCounts.xTileCoords = (frameBuffer->_sampleCounts).xTileCoords;
    (peVar1->frameBuffer)._sampleCounts.yTileCoords = bVar6;
    PVar7 = (frameBuffer->_sampleCounts).type;
    uVar8 = *(undefined4 *)&(frameBuffer->_sampleCounts).field_0x4;
    pcVar2 = (frameBuffer->_sampleCounts).base;
    sVar3 = (frameBuffer->_sampleCounts).xStride;
    sVar4 = (frameBuffer->_sampleCounts).yStride;
    iVar9 = (frameBuffer->_sampleCounts).ySampling;
    dVar5 = (frameBuffer->_sampleCounts).fillValue;
    (peVar1->frameBuffer)._sampleCounts.xSampling = (frameBuffer->_sampleCounts).xSampling;
    (peVar1->frameBuffer)._sampleCounts.ySampling = iVar9;
    (peVar1->frameBuffer)._sampleCounts.fillValue = dVar5;
    (peVar1->frameBuffer)._sampleCounts.xStride = sVar3;
    (peVar1->frameBuffer)._sampleCounts.yStride = sVar4;
    (peVar1->frameBuffer)._sampleCounts.type = PVar7;
    *(undefined4 *)&(peVar1->frameBuffer)._sampleCounts.field_0x4 = uVar8;
    (peVar1->frameBuffer)._sampleCounts.base = pcVar2;
    ((this->_data).
     super___shared_ptr<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    frameBufferValid = true;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  std::__throw_system_error(iVar9);
}

Assistant:

void
DeepScanLineInputFile::setFrameBuffer (const DeepFrameBuffer& frameBuffer)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (_data->_mx);
#endif
    _data->prepFillList (frameBuffer, _data->fill_list);
    _data->frameBuffer = frameBuffer;
    _data->frameBufferValid = true;
}